

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O2

void tlsio_openssl_DestroyOption(char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  
  if (name == (char *)0x0 || value == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar3 = "invalid parameter detected: const char* name=%p, const void* value=%p";
    iVar1 = 0x116;
  }
  else {
    iVar1 = strcmp(name,"TrustedCerts");
    if ((((((iVar1 == 0) || (iVar1 = strcmp(name,"CipherSuite"), iVar1 == 0)) ||
          (iVar1 = strcmp(name,"x509certificate"), iVar1 == 0)) ||
         ((iVar1 = strcmp(name,"x509privatekey"), iVar1 == 0 ||
          (iVar1 = strcmp(name,"x509EccCertificate"), iVar1 == 0)))) ||
        ((iVar1 = strcmp(name,"x509EccAliasKey"), iVar1 == 0 ||
         ((iVar1 = strcmp(name,"tls_version"), iVar1 == 0 ||
          (iVar1 = strcmp(name,"Engine"), iVar1 == 0)))))) ||
       (iVar1 = strcmp(name,"x509PrivatekeyType"), iVar1 == 0)) {
      free(value);
      return;
    }
    iVar1 = strcmp(name,"tls_validation_callback");
    if (iVar1 == 0) {
      return;
    }
    iVar1 = strcmp(name,"tls_validation_callback_data");
    if (iVar1 == 0) {
      return;
    }
    iVar1 = strcmp(name,"underlying_io_options");
    if (iVar1 == 0) {
      OptionHandler_Destroy((OPTIONHANDLER_HANDLE)value);
      return;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar3 = "not handled option : %s";
    iVar1 = 0x135;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/tlsio_openssl.c"
            ,"tlsio_openssl_DestroyOption",iVar1,1,pcVar3,name);
  return;
}

Assistant:

static void tlsio_openssl_DestroyOption(const char* name, const void* value)
{
    /*since all options for this layer are actually string copies., disposing of one is just calling free*/
    if (
        (name == NULL) || (value == NULL)
        )
    {
        LogError("invalid parameter detected: const char* name=%p, const void* value=%p", name, value);
    }
    else
    {
        if (
            (strcmp(name, OPTION_TRUSTED_CERT) == 0) ||
            (strcmp(name, OPTION_OPENSSL_CIPHER_SUITE) == 0) ||
            (strcmp(name, SU_OPTION_X509_CERT) == 0) ||
            (strcmp(name, SU_OPTION_X509_PRIVATE_KEY) == 0) ||
            (strcmp(name, OPTION_X509_ECC_CERT) == 0) ||
            (strcmp(name, OPTION_X509_ECC_KEY) == 0) ||
            (strcmp(name, OPTION_TLS_VERSION) == 0) || 
            (strcmp(name, OPTION_OPENSSL_ENGINE) == 0) || 
            (strcmp(name, OPTION_OPENSSL_PRIVATE_KEY_TYPE) == 0)
           )
        {
            free((void*)value);
        }
        else if (
            (strcmp(name, "tls_validation_callback") == 0) ||
            (strcmp(name, "tls_validation_callback_data") == 0)
            )
        {
            // nothing to free.
        }
        else if (strcmp(name, OPTION_UNDERLYING_IO_OPTIONS) == 0)
        {
            OptionHandler_Destroy((OPTIONHANDLER_HANDLE)value);
        }
        else
        {
            LogError("not handled option : %s", name);
        }
    }
}